

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::equals(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *val,int param_4)

{
  int iVar1;
  CVmObject *pCVar2;
  vm_filnam_ext *pvVar3;
  undefined8 *puVar4;
  long *plVar5;
  char *str_00;
  int *in_RDX;
  CVmObjFileName *in_RDI;
  err_frame_t err_cur__;
  int eq;
  char *strz;
  char *str;
  CVmObjFileName *fn;
  vm_val_t *in_stack_fffffffffffffea8;
  void *pvVar6;
  size_t in_stack_fffffffffffffeb0;
  undefined8 uVar7;
  CVmObject *local_138;
  uint local_128 [2];
  undefined8 local_120;
  void *local_118;
  __jmp_buf_tag _Stack_110;
  int local_44;
  char *local_40;
  char *local_38;
  CVmObject *local_30;
  int local_4;
  
  if (*in_RDX == 5) {
    pCVar2 = vm_objp(0);
    iVar1 = (*pCVar2->_vptr_CVmObject[1])(pCVar2,metaclass_reg_);
    if (iVar1 != 0) {
      local_138 = vm_objp(0);
      goto LAB_002ea614;
    }
  }
  local_138 = (CVmObject *)0x0;
LAB_002ea614:
  local_30 = local_138;
  if (local_138 == (CVmObject *)0x0) {
    local_38 = vm_val_t::get_as_string(in_stack_fffffffffffffea8);
    if (local_38 == (char *)0x0) {
      local_4 = 0;
    }
    else {
      local_40 = (char *)0x0;
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      local_120 = *puVar4;
      plVar5 = (long *)_ZTW11G_err_frame();
      *plVar5 = (long)local_128;
      local_128[0] = _setjmp(&_Stack_110);
      if (local_128[0] == 0) {
        str_00 = local_38 + 2;
        vmb_get_len((char *)0x2ea6e6);
        local_40 = lib_copy_str(str_00,in_stack_fffffffffffffeb0);
        pvVar3 = get_ext(in_RDI);
        vm_filnam_ext::get_str(pvVar3);
        local_44 = fn_file_names_equal((char *)in_stack_fffffffffffffea8,(char *)0x2ea71d);
      }
      if ((local_128[0] & 0x8000) == 0) {
        local_128[0] = local_128[0] | 0x8000;
        lib_free_str((char *)0x2ea74c);
      }
      uVar7 = local_120;
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      *puVar4 = uVar7;
      if ((local_128[0] & 0x4001) != 0) {
        puVar4 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(uint *)*puVar4 & 2) != 0) {
          plVar5 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar5 + 0x10));
        }
        pvVar6 = local_118;
        plVar5 = (long *)_ZTW11G_err_frame();
        *(void **)(*plVar5 + 0x10) = pvVar6;
        err_rethrow();
      }
      if ((local_128[0] & 2) != 0) {
        free(local_118);
      }
      local_4 = local_44;
    }
  }
  else {
    pvVar3 = get_ext(in_RDI);
    vm_filnam_ext::get_str(pvVar3);
    pvVar3 = get_ext((CVmObjFileName *)local_30);
    vm_filnam_ext::get_str(pvVar3);
    local_4 = fn_file_names_equal((char *)in_stack_fffffffffffffea8,(char *)0x2ea660);
  }
  return local_4;
}

Assistant:

int CVmObjFileName::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                           int /*depth*/) const
{
    /* check the type of the other value */
    CVmObjFileName *fn;
    const char *str;
    if ((fn = vm_val_cast(CVmObjFileName, val)) != 0)
    {
        /* it's another FileName object - compare its path */
        return fn_file_names_equal(
            vmg_ get_ext()->get_str(), fn->get_ext()->get_str());
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        char *strz = 0;
        int eq;
        err_try
        {
            /* make a null-terminated copy of the other name */
            strz = lib_copy_str(str + VMB_LEN, vmb_get_len(str));
            
            /* compare the names */
            eq = fn_file_names_equal(vmg_ get_ext()->get_str(), strz);
        }
        err_finally
        {
            lib_free_str(strz);
        }